

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDFrames(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_50;
  int c;
  int fVerbose;
  int fInitial;
  int nFrames;
  int nPrefix;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fInitial = 5;
  fVerbose = 5;
  c = 0;
  local_50 = 0;
  Extra_UtilGetoptReset();
LAB_00273923:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"NFivh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      if (fVerbose < fInitial) {
        Abc_Print(-1,"Prefix (%d) cannot be more than the number of frames (%d).\n",
                  (ulong)(uint)fInitial,(ulong)(uint)fVerbose);
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        pAVar2 = Abc_NtkStrash(pAVar2,0,0,0);
        _nFrames = Abc_NtkDarFrames(pAVar2,fInitial,fVerbose,c,local_50);
        Abc_NtkDelete(pAVar2);
      }
      else {
        _nFrames = Abc_NtkDarFrames(pAVar2,fInitial,fVerbose,c,local_50);
      }
      if (_nFrames == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Unrolling the network has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,_nFrames);
      return 0;
    }
    switch(iVar1) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00273b49;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      iVar1 = fVerbose;
      break;
    default:
      goto LAB_00273b49;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_00273b49;
      }
      fInitial = atoi(argv[globalUtilOptind]);
      iVar1 = fInitial;
      break;
    case 0x68:
      goto LAB_00273b49;
    case 0x69:
      c = c ^ 1;
      goto LAB_00273923;
    case 0x76:
      local_50 = local_50 ^ 1;
      goto LAB_00273923;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 1) {
LAB_00273b49:
      Abc_Print(-2,"usage: dframes [-NF <num>] [-ivh]\n");
      Abc_Print(-2,"\t         unrolls the network with simplification\n");
      Abc_Print(-2,"\t-N num : the number of frames to use as prefix [default = %d]\n",
                (ulong)(uint)fInitial);
      Abc_Print(-2,"\t-F num : the number of frames to unroll [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar3 = "no";
      if (c != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-i     : toggles initializing the first frame [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_50 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles outputting verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDFrames( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkTemp, * pNtkRes;
    int nPrefix;
    int nFrames;
    int fInitial;
    int fVerbose;
    int c;

    extern Abc_Ntk_t * Abc_NtkDarFrames( Abc_Ntk_t * pNtk, int nPrefix, int nFrames, int fInitial, int fVerbose );
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    nPrefix  = 5;
    nFrames  = 5;
    fInitial = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NFivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nPrefix = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPrefix <= 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames <= 0 )
                goto usage;
            break;
        case 'i':
            fInitial ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( nPrefix > nFrames )
    {
        Abc_Print( -1, "Prefix (%d) cannot be more than the number of frames (%d).\n", nPrefix, nFrames );
        return 1;
    }

    // get the new network
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkRes  = Abc_NtkDarFrames( pNtkTemp, nPrefix, nFrames, fInitial, fVerbose );
        Abc_NtkDelete( pNtkTemp );
    }
    else
        pNtkRes  = Abc_NtkDarFrames( pNtk, nPrefix, nFrames, fInitial, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Unrolling the network has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dframes [-NF <num>] [-ivh]\n" );
    Abc_Print( -2, "\t         unrolls the network with simplification\n" );
    Abc_Print( -2, "\t-N num : the number of frames to use as prefix [default = %d]\n", nPrefix );
    Abc_Print( -2, "\t-F num : the number of frames to unroll [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-i     : toggles initializing the first frame [default = %s]\n", fInitial? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles outputting verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}